

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O1

void * __thiscall Lib::FixedSizeAllocator<8UL>::alloc(FixedSizeAllocator<8UL> *this)

{
  void *recycled;
  size_t sVar1;
  void **ppvVar2;
  char *pcVar3;
  
  ppvVar2 = this->free_list;
  if (ppvVar2 == (void **)0x0) {
    sVar1 = (this->current).remaining;
    if (sVar1 == 0) {
      pcVar3 = (char *)::operator_new(0x2000);
      (this->current).bytes = pcVar3;
      (this->current).remaining = 0x1ff8;
      ppvVar2 = (void **)(pcVar3 + 0x1ff8);
    }
    else {
      sVar1 = sVar1 - 8;
      (this->current).remaining = sVar1;
      ppvVar2 = (void **)((this->current).bytes + sVar1);
    }
  }
  else {
    this->free_list = (void **)*ppvVar2;
  }
  return ppvVar2;
}

Assistant:

void *alloc() {
    // first look if there's anything in the free list
    if(free_list) {
      void *recycled = free_list;
      free_list = static_cast<void **>(*free_list);
      return recycled;
    }

    // then check if the current block has space
    if(current.remaining)
      return current.alloc();

    // current block full, get a new one
    current.bytes = static_cast<char *>(::operator new(COUNT * SIZE));
    current.remaining = COUNT * SIZE;
    return current.alloc();
  }